

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statamain.cpp
# Opt level: O0

ST_retcode stata_call(int argc,char **argv)

{
  pointer *this;
  char *pcVar1;
  pointer pMVar2;
  uint dim;
  uint uVar3;
  ST_int SVar4;
  Scalar *pSVar5;
  double dVar6;
  double volume;
  vector<int,_std::allocator<int>_> edges;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  vertices;
  ST_double z;
  uint j;
  uint i;
  VectorXd v;
  uint rows;
  undefined1 local_40 [4];
  uint cols;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  star;
  char *scal;
  char *mat;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    pcVar1 = *argv;
    star.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv[1];
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_40);
    dim = (*_stata_->colsof)(pcVar1);
    uVar3 = (*_stata_->rowsof)(pcVar1);
    if ((dim == 0) || (uVar3 == 0)) {
      myprintf("Invalid rows/columns\n");
      argv_local._4_4_ = 0xc6;
      v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 1;
    }
    else {
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)&j,(ulong)dim);
      for (z._4_4_ = 1; z._4_4_ <= uVar3; z._4_4_ = z._4_4_ + 1) {
        for (z._0_4_ = 1; z._0_4_ <= dim; z._0_4_ = z._0_4_ + 1) {
          SVar4 = (*_stata_->safematel)
                            (pcVar1,z._4_4_,z._0_4_,
                             (ST_double *)
                             &vertices.
                              super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pMVar2 = vertices.
                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (SVar4 != 0) {
            myprintf("Error while reading value at [%d,%d]\n",(ulong)z._4_4_,(ulong)z._0_4_);
            argv_local._4_4_ = 0xc6;
            v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_
                 = 1;
            goto LAB_00157324;
          }
          pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&j,
                              (ulong)(z._0_4_ - 1));
          *pSVar5 = (Scalar)pMVar2;
        }
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::push_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)local_40,(value_type *)&j);
      }
      this = &edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage;
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)this);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&volume);
      dVar6 = zonotope_volume((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)local_40,
                              (vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)this,(vector<int,_std::allocator<int>_> *)&volume,dim);
      SVar4 = (*_stata_->scalsave)
                        ((char *)star.
                                 super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,dVar6);
      if (SVar4 == 0) {
        argv_local._4_4_ = 0;
      }
      else {
        myprintf("Unable to save result\n");
        argv_local._4_4_ = 0xc6;
      }
      v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 1;
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&volume);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)&edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
LAB_00157324:
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&j);
    }
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)local_40);
  }
  else {
    myprintf("Invalid arguments\n");
    argv_local._4_4_ = 0xc6;
  }
  return argv_local._4_4_;
}

Assistant:

STDLL stata_call(int argc, char *argv[])
{
	dbgprintf("\nSTATA_ZONOTOPE_PLUGIN_BEGIN\n");

	if (argc != 2)
	{
		myprintf("Invalid arguments\n");
		return 198;
	}

	char *mat = argv[0];
	char *scal = argv[1];

	std::vector<Eigen::VectorXd> star;

	unsigned int cols = SF_col(mat);
	unsigned int rows = SF_row(mat);

	if (!((cols > 0) && (rows > 0)))
	{
		myprintf("Invalid rows/columns\n");
		return 198;
	}

	Eigen::VectorXd v(cols);
	for (unsigned int i = 1; i <= rows; i++)
	{
		for (unsigned int j = 1; j <= cols; j++ )
		{
			ST_double z;
			if (SF_mat_el(mat, i, j, &z))
			{
				myprintf("Error while reading value at [%d,%d]\n", i, j);
				return 198;
			}
			v[j - 1] = z;
		}
		star.push_back(v);
	}

	std::vector<Eigen::VectorXd> vertices;
	std::vector<int> edges;

	double volume = zonotope_volume(star, vertices, edges, cols);

	if (SF_scal_save(scal, volume))
	{
		myprintf("Unable to save result\n");
		return 198;
	}

	dbgprintf("\nSTATA_ZONOTOPE_PLUGIN_END\n");
	return 0;
}